

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int Curl_hash_init(curl_hash *h,int slots,hash_function hfunc,comp_function comparator,
                  curl_hash_dtor dtor)

{
  curl_llist **ppcVar1;
  curl_llist *pcVar2;
  int iVar3;
  int local_3c;
  int i;
  curl_hash_dtor dtor_local;
  comp_function comparator_local;
  hash_function hfunc_local;
  int slots_local;
  curl_hash *h_local;
  
  if ((((slots == 0) || (hfunc == (hash_function)0x0)) || (comparator == (comp_function)0x0)) ||
     (dtor == (curl_hash_dtor)0x0)) {
    h_local._4_4_ = 1;
  }
  else {
    h->hash_func = hfunc;
    h->comp_func = comparator;
    h->dtor = dtor;
    h->size = 0;
    h->slots = slots;
    ppcVar1 = (curl_llist **)(*Curl_cmalloc)((long)slots << 3);
    h->table = ppcVar1;
    if (h->table == (curl_llist **)0x0) {
      h->slots = 0;
      h_local._4_4_ = 1;
    }
    else {
      for (local_3c = 0; local_3c < slots; local_3c = local_3c + 1) {
        pcVar2 = Curl_llist_alloc(hash_element_dtor);
        h->table[local_3c] = pcVar2;
        if (h->table[local_3c] == (curl_llist *)0x0) {
          while (iVar3 = local_3c + -1, local_3c != 0) {
            Curl_llist_destroy(h->table[iVar3],(void *)0x0);
            h->table[iVar3] = (curl_llist *)0x0;
            local_3c = iVar3;
          }
          (*Curl_cfree)(h->table);
          h->table = (curl_llist **)0x0;
          h->slots = 0;
          return 1;
        }
      }
      h_local._4_4_ = 0;
    }
  }
  return h_local._4_4_;
}

Assistant:

int
Curl_hash_init(struct curl_hash *h,
               int slots,
               hash_function hfunc,
               comp_function comparator,
               curl_hash_dtor dtor)
{
  int i;

  if(!slots || !hfunc || !comparator ||!dtor) {
    return 1; /* failure */
  }

  h->hash_func = hfunc;
  h->comp_func = comparator;
  h->dtor = dtor;
  h->size = 0;
  h->slots = slots;

  h->table = malloc(slots * sizeof(struct curl_llist *));
  if(h->table) {
    for(i = 0; i < slots; ++i) {
      h->table[i] = Curl_llist_alloc((curl_llist_dtor) hash_element_dtor);
      if(!h->table[i]) {
        while(i--) {
          Curl_llist_destroy(h->table[i], NULL);
          h->table[i] = NULL;
        }
        free(h->table);
        h->table = NULL;
        h->slots = 0;
        return 1; /* failure */
      }
    }
    return 0; /* fine */
  }
  else {
    h->slots = 0;
    return 1; /* failure */
  }
}